

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O3

void __thiscall
upb::generator::Output::operator()
          (Output *this,string_view format,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg,
          unsigned_short *arg_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg_2,uchar *arg_3,
          uchar *arg_4,uchar *arg_5)

{
  size_type sVar1;
  Nonnull<char_*> pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *num_args;
  string_view format_00;
  string_view data;
  char *local_1a8;
  size_t local_1a0;
  char local_198;
  undefined7 uStack_197;
  Output *local_188;
  pointer local_180;
  size_type local_178;
  pointer local_170;
  Nonnull<std::string_*> local_168;
  char *local_160;
  long local_158;
  Nonnull<char_*> local_150;
  char local_148 [32];
  long local_128;
  Nonnull<char_*> pcStack_120;
  char local_118 [32];
  long local_f8;
  Nonnull<char_*> pcStack_f0;
  char local_e8 [32];
  long local_c8;
  Nonnull<char_*> pcStack_c0;
  char local_b8 [32];
  size_type local_98;
  pointer local_90;
  long local_88;
  Nonnull<char_*> pcStack_80;
  size_type local_78;
  pointer local_70;
  long local_68;
  Nonnull<char_*> pcStack_60;
  long local_58;
  Nonnull<char_*> pcStack_50;
  long local_48;
  Nonnull<char_*> local_40;
  
  local_160 = format._M_str;
  local_168 = (Nonnull<std::string_*>)format._M_len;
  local_170 = (arg->_M_dataplus)._M_p;
  local_178 = arg->_M_string_length;
  num_args = arg_2;
  local_188 = this;
  pcVar2 = absl::lts_20250127::numbers_internal::FastIntToBuffer((uint)*arg_1,local_b8);
  local_c8 = (long)pcVar2 - (long)local_b8;
  local_180 = (arg_2->_M_dataplus)._M_p;
  sVar1 = arg_2->_M_string_length;
  pcStack_c0 = local_b8;
  pcVar2 = absl::lts_20250127::numbers_internal::FastIntToBuffer((uint)*arg_3,local_e8);
  local_f8 = (long)pcVar2 - (long)local_e8;
  pcStack_f0 = local_e8;
  pcVar2 = absl::lts_20250127::numbers_internal::FastIntToBuffer((uint)*arg_4,local_118);
  local_128 = (long)pcVar2 - (long)local_118;
  pcStack_120 = local_118;
  pcVar2 = absl::lts_20250127::numbers_internal::FastIntToBuffer((uint)*arg_5,local_148);
  local_158 = (long)pcVar2 - (long)local_148;
  local_1a0 = 0;
  local_198 = '\0';
  local_98 = local_178;
  local_90 = local_170;
  local_88 = local_c8;
  pcStack_80 = pcStack_c0;
  local_70 = local_180;
  local_68 = local_f8;
  pcStack_60 = pcStack_f0;
  local_58 = local_128;
  pcStack_50 = pcStack_120;
  format_00._M_str = (char *)&local_98;
  format_00._M_len = (size_t)local_160;
  local_1a8 = &local_198;
  local_150 = local_148;
  local_78 = sVar1;
  local_48 = local_158;
  local_40 = local_148;
  absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
            ((substitute_internal *)&local_1a8,local_168,format_00,
             (Nullable<const_absl::string_view_*>)&DAT_00000006,(size_t)num_args);
  data._M_str = local_1a8;
  data._M_len = local_1a0;
  Write(local_188,data);
  if (local_1a8 != &local_198) {
    operator_delete(local_1a8,CONCAT71(uStack_197,local_198) + 1);
  }
  return;
}

Assistant:

void operator()(absl::string_view format, const Arg&... arg) {
    Write(absl::Substitute(format, arg...));
  }